

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture3DOffsetBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float r;
  float fVar1;
  float fVar2;
  float *pfVar3;
  Vector<int,_3> local_54;
  undefined1 local_48 [16];
  Vector<float,_4> local_38;
  tcu local_28 [8];
  float local_20 [2];
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar3 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  t = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  r = *pfVar3;
  fVar1 = local_18->lod;
  pfVar3 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  fVar2 = *pfVar3;
  tcu::Vector<int,_3>::Vector(&local_54,&local_18->offset);
  texture3DOffset((ShaderEvalContext *)local_48,s,t,r,fVar1 + fVar2,(IVec3 *)c);
  tcu::operator*((tcu *)&local_38,(Vector<float,_4> *)local_48,&local_18->scale);
  tcu::operator+(local_28,&local_38,&local_18->bias);
  *(tcu (*) [8])p_local[10].scale.m_data = local_28;
  *(float (*) [2])(p_local[10].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture3DOffsetBias			(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), p.lod+c.in[1].x(), p.offset)*p.scale + p.bias; }